

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O0

void manage_thrashing_behavior
               (vector<ProcessProgress,_std::allocator<ProcessProgress>_> *child_processes,
               StallState *old_state,StallState *new_state)

{
  undefined4 uVar1;
  float *pfVar2;
  memory_order *pmVar3;
  size_type sVar4;
  uint *puVar5;
  memory_order local_64;
  uint local_58;
  bool local_52;
  char local_51;
  uint local_50;
  bool go_up;
  float fStack_4c;
  bool go_down;
  uint target_running_processes;
  int local_44;
  float io_stall_ratio;
  int32_t delta_dirty_pages_mib;
  float io_stall_us;
  float delta_us;
  StallState *new_state_local;
  StallState *old_state_local;
  vector<ProcessProgress,_std::allocator<ProcessProgress>_> *child_processes_local;
  int local_18;
  memory_order __b;
  memory_order *local_10;
  
  delta_dirty_pages_mib =
       (int32_t)((float)(new_state->timestamp_ns - old_state->timestamp_ns) * 0.001);
  io_stall_ratio = (float)(new_state->io_stalled_us - old_state->io_stalled_us);
  local_44 = 0;
  if ((-1 < new_state->dirty_pages_mib) && (-1 < old_state->dirty_pages_mib)) {
    local_44 = new_state->dirty_pages_mib - old_state->dirty_pages_mib;
  }
  target_running_processes = 0xbf800000;
  if ((-1 < new_state->io_stalled_us) && (-1 < old_state->io_stalled_us)) {
    target_running_processes = (uint)(io_stall_ratio / (float)delta_dirty_pages_mib);
  }
  fStack_4c = 1.0;
  _io_stall_us = new_state;
  new_state_local = old_state;
  old_state_local = (StallState *)child_processes;
  pfVar2 = std::min<float>(&stack0xffffffffffffffb4,(float *)&target_running_processes);
  target_running_processes = (uint)*pfVar2;
  local_50 = Global::running_processes;
  local_51 = '\0';
  local_52 = false;
  if ((Global::target_running_processes_dirty_pages & 1) != 0) {
    if (local_44 < 0x33) {
      local_52 = local_44 < -10;
    }
    else {
      local_51 = '\x01';
    }
  }
  if (((Global::target_running_processes_io_stall & 1) != 0) &&
     (0.0 <= (float)target_running_processes)) {
    if ((float)target_running_processes <= 0.3) {
      if ((float)target_running_processes < 0.1) {
        local_52 = true;
      }
    }
    else {
      local_51 = '\x01';
    }
  }
  if (Global::running_processes == 0) {
    local_52 = true;
  }
  if ((local_51 == '\0') || (Global::running_processes == 0)) {
    if (local_52 != false) {
      local_50 = Global::running_processes + 1;
    }
  }
  else {
    local_50 = Global::running_processes - 1;
  }
  if (Global::control_block != 0) {
    pmVar3 = (memory_order *)(Global::control_block + 0xc90);
    if (0.0 <= (float)target_running_processes) {
      local_64 = (memory_order)((float)target_running_processes * 100.0);
    }
    else {
      local_64 = ~memory_order_relaxed;
    }
    __b = local_64;
    local_18 = 0;
    local_10 = pmVar3;
    child_processes_local._4_4_ = std::operator&(memory_order_relaxed,__memory_order_mask);
    child_processes_local._0_4_ = __b;
    if (local_18 == 3) {
      *pmVar3 = __b;
    }
    else if (local_18 == 5) {
      LOCK();
      *pmVar3 = __b;
      UNLOCK();
    }
    else {
      *pmVar3 = __b;
    }
  }
  uVar1 = *(undefined4 *)&_io_stall_us->field_0x4;
  new_state_local->dirty_pages_mib = _io_stall_us->dirty_pages_mib;
  *(undefined4 *)&new_state_local->field_0x4 = uVar1;
  new_state_local->io_stalled_us = _io_stall_us->io_stalled_us;
  new_state_local->timestamp_ns = _io_stall_us->timestamp_ns;
  sVar4 = std::vector<ProcessProgress,_std::allocator<ProcessProgress>_>::size
                    ((vector<ProcessProgress,_std::allocator<ProcessProgress>_> *)old_state_local);
  local_58 = (uint)sVar4;
  puVar5 = std::min<unsigned_int>(&local_50,&local_58);
  Global::target_running_processes = *puVar5;
  return;
}

Assistant:

static void manage_thrashing_behavior(std::vector<ProcessProgress> &child_processes,
                                      StallState &old_state, const StallState &new_state)
{
	// It is quite easy to overload the system with IO if we're not careful, so check for this.

	float delta_us = 1e-3f * float(new_state.timestamp_ns - old_state.timestamp_ns);
	float io_stall_us = float(new_state.io_stalled_us - old_state.io_stalled_us);

	int32_t delta_dirty_pages_mib = 0;
	if (new_state.dirty_pages_mib >= 0 && old_state.dirty_pages_mib >= 0)
		delta_dirty_pages_mib = new_state.dirty_pages_mib - old_state.dirty_pages_mib;

	float io_stall_ratio = -1.0f;
	if (new_state.io_stalled_us >= 0 && old_state.io_stalled_us >= 0)
		io_stall_ratio = io_stall_us / delta_us;
	io_stall_ratio = std::min(1.0f, io_stall_ratio);

	unsigned target_running_processes = Global::running_processes;

	// Some heuristics here.
	bool go_down = false;
	bool go_up = false;

	if (Global::target_running_processes_dirty_pages)
	{
		if (delta_dirty_pages_mib > 50)
		{
			// If we (or someone else) created more than 50 MiB of dirty data in this tick,
			// we should lower number of processes.
			go_down = true;
		}
		else if (delta_dirty_pages_mib < -10)
		{
			// Dirty pages is going down, can increase CPU load now.
			go_up = true;
		}
	}

	// IO stalls usually means someone is hammering IO.
	// We don't want to contribute to that.
	if (Global::target_running_processes_io_stall && io_stall_ratio >= 0.0f)
	{
		if (io_stall_ratio > 0.3f)
			go_down = true;
		else if (io_stall_ratio < 0.1f)
			go_up = true;
	}

	// Ensure forward progress. Make at least one process active
	// if we have had a period of complete sleep.
	if (target_running_processes == 0)
		go_up = true;

	if (go_down && target_running_processes)
		target_running_processes--;
	else if (go_up)
		target_running_processes++;

	if (Global::control_block)
	{
		Global::control_block->io_stall_percentage.store(
				io_stall_ratio < 0.0f ? -1 : int32_t(io_stall_ratio * 100.0f),
				std::memory_order_relaxed);
	}

	old_state = new_state;

	target_running_processes = std::min<unsigned>(target_running_processes, child_processes.size());
	Global::target_running_processes = target_running_processes;
}